

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tipc_listener.cpp
# Opt level: O2

int __thiscall zmq::tipc_listener_t::set_local_address(tipc_listener_t *this,char *addr_)

{
  tipc_address_t *this_00;
  string *addr__00;
  socket_base_t *this_01;
  bool bVar1;
  int iVar2;
  fd_t fVar3;
  zmq_socklen_t sa_len_;
  socklen_t __len;
  int iVar4;
  sockaddr *psVar5;
  int *piVar6;
  tipc_address_t local_c4;
  sockaddr_storage ss;
  
  this_00 = &this->_address;
  iVar2 = tipc_address_t::resolve(this_00,addr_);
  if (iVar2 != 0) {
    return -1;
  }
  psVar5 = tipc_address_t::addr(this_00);
  bVar1 = tipc_address_t::is_random(this_00);
  if ((!bVar1) && (psVar5->sa_data[0] == '\x03')) {
    piVar6 = __errno_location();
    *piVar6 = 0x16;
    return -1;
  }
  fVar3 = open_socket(0x1e,1,0);
  (this->super_stream_listener_base_t)._s = fVar3;
  if (fVar3 == -1) {
    return -1;
  }
  bVar1 = tipc_address_t::is_random(this_00);
  if (bVar1) {
    iVar2 = 0;
    sa_len_ = get_socket_address((this->super_stream_listener_base_t)._s,socket_end_local,&ss);
    if (sa_len_ == 0) goto LAB_0017132f;
    tipc_address_t::tipc_address_t(&local_c4,(sockaddr *)&ss,sa_len_);
    (this->_address).address.addr.nameseq.upper = local_c4.address.addr.nameseq.upper;
    this_00->_random = local_c4._random;
    *(undefined3 *)&this_00->field_0x1 = local_c4._1_3_;
    (this_00->address).family = local_c4.address.family;
    (this_00->address).addrtype = local_c4.address.addrtype;
    (this_00->address).scope = local_c4.address.scope;
    (this->_address).address.addr.id = local_c4.address.addr.id;
  }
  addr__00 = &(this->super_stream_listener_base_t)._endpoint;
  tipc_address_t::to_string(this_00,addr__00);
  bVar1 = tipc_address_t::is_service(this_00);
  if (bVar1) {
    iVar2 = (this->super_stream_listener_base_t)._s;
    psVar5 = tipc_address_t::addr(this_00);
    __len = tipc_address_t::addrlen(this_00);
    iVar4 = bind(iVar2,(sockaddr *)psVar5,__len);
    iVar2 = (int)psVar5;
    if (iVar4 != 0) goto LAB_0017132f;
  }
  iVar2 = (this->super_stream_listener_base_t).super_own_t.options.backlog;
  iVar4 = listen((this->super_stream_listener_base_t)._s,iVar2);
  if (iVar4 == 0) {
    this_01 = (this->super_stream_listener_base_t)._socket;
    make_unconnected_bind_endpoint_pair((endpoint_uri_pair_t *)&ss,addr__00);
    socket_base_t::event_listening
              (this_01,(endpoint_uri_pair_t *)&ss,(this->super_stream_listener_base_t)._s);
    endpoint_uri_pair_t::~endpoint_uri_pair_t((endpoint_uri_pair_t *)&ss);
    return 0;
  }
LAB_0017132f:
  piVar6 = __errno_location();
  iVar4 = *piVar6;
  stream_listener_base_t::close(&this->super_stream_listener_base_t,iVar2);
  *piVar6 = iVar4;
  return -1;
}

Assistant:

int zmq::tipc_listener_t::set_local_address (const char *addr_)
{
    // Convert str to address struct
    int rc = _address.resolve (addr_);
    if (rc != 0)
        return -1;

    // Cannot bind non-random Port Identity
    const sockaddr_tipc *const a =
      reinterpret_cast<const sockaddr_tipc *> (_address.addr ());
    if (!_address.is_random () && a->addrtype == TIPC_ADDR_ID) {
        errno = EINVAL;
        return -1;
    }

    //  Create a listening socket.
    _s = open_socket (AF_TIPC, SOCK_STREAM, 0);
    if (_s == retired_fd)
        return -1;

    // If random Port Identity, update address object to reflect the assigned address
    if (_address.is_random ()) {
        struct sockaddr_storage ss;
        const zmq_socklen_t sl = get_socket_address (_s, socket_end_local, &ss);
        if (sl == 0)
            goto error;

        _address =
          tipc_address_t (reinterpret_cast<struct sockaddr *> (&ss), sl);
    }


    _address.to_string (_endpoint);

    //  Bind the socket to tipc name
    if (_address.is_service ()) {
#ifdef ZMQ_HAVE_VXWORKS
        rc = bind (_s, (sockaddr *) address.addr (), address.addrlen ());
#else
        rc = bind (_s, _address.addr (), _address.addrlen ());
#endif
        if (rc != 0)
            goto error;
    }

    //  Listen for incoming connections.
    rc = listen (_s, options.backlog);
    if (rc != 0)
        goto error;

    _socket->event_listening (make_unconnected_bind_endpoint_pair (_endpoint),
                              _s);
    return 0;

error:
    int err = errno;
    close ();
    errno = err;
    return -1;
}